

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-reverse-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase74::run(TestCase74 *this)

{
  DebugComparison<int,_unsigned_char_&> _kjCondition;
  
  return;
}

Assistant:

TEST(EndianReverse, FourBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint32_t>* vals = reinterpret_cast<WireValue<uint32_t>*>(bytes);

  EXPECT_EQ(0x12345678u, vals[0].get());

  vals[0].set(0x23456789);

  EXPECT_EQ(0x23, bytes[0]);
  EXPECT_EQ(0x45, bytes[1]);
  EXPECT_EQ(0x67, bytes[2]);
  EXPECT_EQ(0x89, bytes[3]);
}